

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_enc.c
# Opt level: O0

WebPEncodingError PutVP8FrameHeader(WebPPicture *pic,int profile,size_t size0)

{
  uint uVar1;
  int iVar2;
  ulong in_RDX;
  int in_ESI;
  long in_RDI;
  uint32_t bits;
  uint8_t vp8_frm_hdr [10];
  undefined1 local_2a;
  undefined1 local_29;
  undefined1 local_28;
  undefined1 local_27;
  undefined1 local_26;
  undefined1 local_25;
  undefined1 local_24;
  undefined1 local_23;
  undefined1 local_22;
  undefined1 local_21;
  WebPEncodingError local_4;
  
  if (in_RDX < 0x80000) {
    uVar1 = in_ESI << 1 | 0x10U | (int)in_RDX << 5;
    local_2a = (undefined1)uVar1;
    local_29 = (undefined1)(uVar1 >> 8);
    local_28 = (undefined1)(uVar1 >> 0x10);
    local_27 = 0x9d;
    local_26 = 1;
    local_25 = 0x2a;
    local_24 = (undefined1)*(undefined4 *)(in_RDI + 8);
    local_23 = (undefined1)((uint)*(undefined4 *)(in_RDI + 8) >> 8);
    local_22 = (undefined1)*(undefined4 *)(in_RDI + 0xc);
    local_21 = (undefined1)((uint)*(undefined4 *)(in_RDI + 0xc) >> 8);
    iVar2 = (**(code **)(in_RDI + 0x60))(&local_2a,10,in_RDI);
    if (iVar2 == 0) {
      local_4 = VP8_ENC_ERROR_BAD_WRITE;
    }
    else {
      local_4 = VP8_ENC_OK;
    }
  }
  else {
    local_4 = VP8_ENC_ERROR_PARTITION0_OVERFLOW;
  }
  return local_4;
}

Assistant:

static WebPEncodingError PutVP8FrameHeader(const WebPPicture* const pic,
                                           int profile, size_t size0) {
  uint8_t vp8_frm_hdr[VP8_FRAME_HEADER_SIZE];
  uint32_t bits;

  if (size0 >= VP8_MAX_PARTITION0_SIZE) {  // partition #0 is too big to fit
    return VP8_ENC_ERROR_PARTITION0_OVERFLOW;
  }

  // Paragraph 9.1.
  bits = 0                         // keyframe (1b)
       | (profile << 1)            // profile (3b)
       | (1 << 4)                  // visible (1b)
       | ((uint32_t)size0 << 5);   // partition length (19b)
  vp8_frm_hdr[0] = (bits >>  0) & 0xff;
  vp8_frm_hdr[1] = (bits >>  8) & 0xff;
  vp8_frm_hdr[2] = (bits >> 16) & 0xff;
  // signature
  vp8_frm_hdr[3] = (VP8_SIGNATURE >> 16) & 0xff;
  vp8_frm_hdr[4] = (VP8_SIGNATURE >>  8) & 0xff;
  vp8_frm_hdr[5] = (VP8_SIGNATURE >>  0) & 0xff;
  // dimensions
  vp8_frm_hdr[6] = pic->width & 0xff;
  vp8_frm_hdr[7] = pic->width >> 8;
  vp8_frm_hdr[8] = pic->height & 0xff;
  vp8_frm_hdr[9] = pic->height >> 8;

  if (!pic->writer(vp8_frm_hdr, sizeof(vp8_frm_hdr), pic)) {
    return VP8_ENC_ERROR_BAD_WRITE;
  }
  return VP8_ENC_OK;
}